

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::computeQuadTexCoord1D
               (vector<float,_std::allocator<float>_> *dst,float left,float right)

{
  pointer pfVar1;
  
  std::vector<float,_std::allocator<float>_>::resize(dst,4);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar1 = left;
  pfVar1[1] = left;
  pfVar1[2] = right;
  pfVar1[3] = right;
  return;
}

Assistant:

void computeQuadTexCoord1D (std::vector<float>& dst, float left, float right)
{
	dst.resize(4);

	dst[0] = left;
	dst[1] = left;
	dst[2] = right;
	dst[3] = right;
}